

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsSet(cmMakefile *this,string *name)

{
  bool bVar1;
  char *val;
  char *value;
  string *name_local;
  cmMakefile *this_local;
  
  val = GetDefinition(this,name);
  if (val == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else if (*val == '\0') {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = cmSystemTools::IsNOTFOUND(val);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::IsSet(const std::string& name) const
{
  const char* value = this->GetDefinition(name);
  if (!value) {
    return false;
  }

  if (!*value) {
    return false;
  }

  if (cmSystemTools::IsNOTFOUND(value)) {
    return false;
  }

  return true;
}